

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O3

ModelPtr unitComplexCycle(bool order)

{
  string *psVar1;
  char cVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  char in_SIL;
  undefined7 in_register_00000039;
  element_type *peVar4;
  char *pcVar5;
  ModelPtr MVar6;
  AssertionResult gtest_ar;
  UnitsPtr u5;
  UnitsPtr u2;
  UnitsPtr u1;
  UnitsPtr u6;
  UnitsPtr u4;
  UnitsPtr u3;
  ValidatorPtr v;
  long *local_d0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  long local_c0 [2];
  long *local_b0;
  unsigned_long local_a8;
  string *local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  string *local_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  string *local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  string *local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  string *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  string *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  shared_ptr *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  peVar4 = (element_type *)CONCAT71(in_register_00000039,order);
  libcellml::Validator::create();
  libcellml::Model::create();
  libcellml::Units::create();
  libcellml::Units::create();
  libcellml::Units::create();
  libcellml::Units::create();
  libcellml::Units::create();
  libcellml::Units::create();
  psVar1 = *(string **)peVar4;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"model","");
  libcellml::NamedEntity::setName(psVar1);
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  if (in_SIL == '\0') {
    libcellml::Model::addUnits(*(shared_ptr **)peVar4);
    libcellml::Model::addUnits(*(shared_ptr **)peVar4);
    libcellml::Model::addUnits(*(shared_ptr **)peVar4);
  }
  else {
    libcellml::Model::addUnits(*(shared_ptr **)peVar4);
    libcellml::Model::addUnits(*(shared_ptr **)peVar4);
    libcellml::Model::addUnits(*(shared_ptr **)peVar4);
  }
  libcellml::Model::addUnits(*(shared_ptr **)peVar4);
  libcellml::Model::addUnits(*(shared_ptr **)peVar4);
  libcellml::Model::addUnits(*(shared_ptr **)peVar4);
  psVar1 = local_80;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"grandfather","");
  libcellml::NamedEntity::setName(psVar1);
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  psVar1 = local_90;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"father","");
  libcellml::NamedEntity::setName(psVar1);
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"grandfather","");
  libcellml::Units::addUnit(local_90);
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  psVar1 = local_50;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"mother","");
  libcellml::NamedEntity::setName(psVar1);
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"grandfather","");
  libcellml::Units::addUnit(local_50);
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  psVar1 = local_60;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"brotherFromAnotherMother","")
  ;
  libcellml::NamedEntity::setName(psVar1);
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"father","");
  libcellml::Units::addUnit(local_60);
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  psVar1 = local_a0;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,"childOfIncest_ButThatsOKApparently","");
  libcellml::NamedEntity::setName(psVar1);
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  psVar1 = local_a0;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"mother","");
  libcellml::Units::addUnit(psVar1);
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"father","");
  libcellml::Units::addUnit(local_a0);
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  psVar1 = local_70;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"sisterFromAnotherFather","");
  libcellml::NamedEntity::setName(psVar1);
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"mother","");
  libcellml::Units::addUnit(local_70);
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  libcellml::Validator::validateModel(local_40);
  local_b0 = (long *)0x0;
  local_a8 = libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_d0,"size_t(0)","v->issueCount()",(unsigned_long *)&local_b0,
             &local_a8);
  if (local_d0._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if (local_c8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_c8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/validator/validator.cpp"
               ,0xa08,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if (local_b0 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_b0 != (long *)0x0)) {
        (**(code **)(*local_b0 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_c8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"brotherFromAnotherMother","")
  ;
  libcellml::Units::addUnit(local_80);
  _Var3._M_pi = extraout_RDX;
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
    _Var3._M_pi = extraout_RDX_00;
  }
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
    _Var3._M_pi = extraout_RDX_01;
  }
  if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
    _Var3._M_pi = extraout_RDX_02;
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    _Var3._M_pi = extraout_RDX_03;
  }
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
    _Var3._M_pi = extraout_RDX_04;
  }
  if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
    _Var3._M_pi = extraout_RDX_05;
  }
  if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
    _Var3._M_pi = extraout_RDX_06;
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    _Var3._M_pi = extraout_RDX_07;
  }
  MVar6.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  MVar6.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
  return (ModelPtr)MVar6.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

libcellml::ModelPtr unitComplexCycle(bool order)
{
    // Simple testing for the directional dependency of units. The first network is:
    //
    //                            <- brotherFromAnotherMother (u4)
    //                 <- father (u2)  <-+
    //     grandfather (u1)              | <- childOfIncest_ButThatsOKApparently (u5)
    //                 <- mother (u3)  <-+
    //                            <- sisterFromAnotherFather (u6)
    //
    // There is an _undirected_ loop between u1-u2-u3-u5 but the directionality of the
    // dependencies here means the network is still valid. Keeping this here to test that
    // the directionality does indeed protect it from forming a cycle.

    libcellml::ValidatorPtr v = libcellml::Validator::create();
    libcellml::ModelPtr m = libcellml::Model::create();

    libcellml::UnitsPtr u1 = libcellml::Units::create();
    libcellml::UnitsPtr u2 = libcellml::Units::create();
    libcellml::UnitsPtr u3 = libcellml::Units::create();
    libcellml::UnitsPtr u4 = libcellml::Units::create();
    libcellml::UnitsPtr u5 = libcellml::Units::create();
    libcellml::UnitsPtr u6 = libcellml::Units::create();

    m->setName("model");

    if (order) {
        m->addUnits(u4);
        m->addUnits(u1);
        m->addUnits(u2);
        m->addUnits(u3);
    } else {
        m->addUnits(u1);
        m->addUnits(u2);
        m->addUnits(u3);
        m->addUnits(u4);
    }
    m->addUnits(u5);
    m->addUnits(u6);

    u1->setName("grandfather"); // Base unit.

    u2->setName("father"); // First generation.
    u2->addUnit("grandfather");

    u3->setName("mother"); // First generation.
    u3->addUnit("grandfather");

    u4->setName("brotherFromAnotherMother"); // Second generation.
    u4->addUnit("father");

    // Second generation depending on both first gen children, still valid, no loops because of directionality.
    u5->setName("childOfIncest_ButThatsOKApparently");
    u5->addUnit("mother");
    u5->addUnit("father");

    u6->setName("sisterFromAnotherFather"); // Second generation.
    u6->addUnit("mother");

    v->validateModel(m);
    EXPECT_EQ(size_t(0), v->issueCount());

    // As soon as a dependency of the grandfather on the brotherFromAnotherMother is added, then a
    // _directed_ loop (u1->u2->u4->u1) is created and the network is no longer valid:
    //
    //     +----------------------------------------------------------+
    //     |                                                          |
    //     |                       <- brotherFromAnotherMother (u4) <-+
    //     |            <- father (u2)  <-+
    //     +- grandfather (u1)            | <- childOfIncest (u5)
    //                  <- mother (u3)  <-+
    //                             <- sisterFromAnotherFather (u6)

    // Time loop Grandfather paradox created! u1 no longer a base variable: u1 -> u4 -> u2 -> u1.
    u1->addUnit("brotherFromAnotherMother");

    return m;
}